

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

type calcGrad(Mesh *mesh,VectorXd *x,double epsilon)

{
  BaseHandle BVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  VectorT<double,_2> *pVVar9;
  VectorT<double,2> *this;
  int iVar10;
  double dVar11;
  VectorXd *in_RDX;
  undefined8 *puVar12;
  undefined8 extraout_RDX;
  long lVar13;
  VectorXd *params;
  int iVar14;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr_1;
  double dVar15;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> _Var16;
  undefined8 uVar17;
  int *piVar18;
  long lVar19;
  double dVar20;
  mesh_ptr pPVar21;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar29;
  type tVar30;
  type tVar31;
  container cVar32;
  type tVar33;
  vector_type vVar34;
  Vec3d dterm2_du0;
  value_type e;
  type normal;
  double projected;
  Vec3d ue1;
  Vec3d pe1;
  ConstFaceVertexCCWIter itr;
  double cot1;
  double cot0;
  Vec2d dterm1_du0;
  Vec2d u1;
  Vec3d ue2;
  double term2;
  double term1;
  VertexHandle vs [3];
  Vec3d pe2;
  Vec2d u2;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  VectorT<double,_3> local_338;
  double local_318;
  double dStack_310;
  double local_300;
  container local_2f8;
  VectorT<double,_3> local_2e8;
  double local_2c8;
  ulong uStack_2c0;
  container local_2b8;
  double local_2a8;
  double local_298;
  container local_290;
  undefined8 *local_278;
  undefined8 local_270;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> local_268;
  ulong uStack_260;
  double local_258;
  VectorXd *local_250;
  double local_248;
  double local_240;
  type local_238;
  undefined1 local_218 [12];
  BaseHandle BStack_20c;
  undefined8 local_208;
  container local_200;
  double dStack_1f0;
  type local_1e8;
  undefined1 local_1c8 [12];
  BaseHandle BStack_1bc;
  undefined8 local_1b8;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  VectorT<double,_2> local_188;
  undefined8 local_178;
  double local_168;
  undefined8 uStack_160;
  container local_158;
  VectorT<double,_3> local_148;
  type local_128;
  Mesh *local_108;
  undefined8 local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  type local_d8;
  int local_c0 [4];
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  type local_a0;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  mesh_ptr local_38;
  
  local_258 = epsilon;
  local_108 = mesh;
  initHashMap((Mesh *)x,in_RDX,epsilon);
  local_1c8._0_8_ =
       (in_RDX->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_278,(long *)local_1c8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_278);
  local_50 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)x);
  local_250 = in_RDX;
  auVar27 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)x);
  while( true ) {
    local_100 = auVar27._8_8_;
    uVar17 = local_100;
    local_1a8 = auVar27._0_8_;
    local_100._0_4_ = auVar27._8_4_;
    if (local_50._8_4_ == (int)local_100 && (double)local_50._0_8_ == local_1a8) break;
    local_c0[2] = -1;
    local_c0[0] = -1;
    local_c0[1] = -1;
    lVar19 = (long)(int)local_50._8_4_;
    lVar13 = x[0xf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_1c8._8_4_ = *(uint *)(lVar13 + lVar19 * 4);
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0xffffffff;
    piVar18 = local_c0;
    local_1c8._0_8_ = x;
    BStack_1bc.idx_ = local_1c8._8_4_;
    while( true ) {
      local_100 = auVar27._8_8_;
      local_1a8 = auVar27._0_8_;
      BVar1.idx_ = ((BaseHandle *)(lVar13 + lVar19 * 4))->idx_;
      stack0xfffffffffffffdf0 = (double)CONCAT44(BVar1.idx_,BVar1.idx_);
      local_208._4_4_ = 0xffffffff;
      local_208._0_4_ = (uint)~BVar1.idx_ >> 0x1f;
      local_218._0_8_ = x;
      bVar7 = OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::operator!=
                        ((GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)local_1c8,
                         (GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)local_218);
      if (!bVar7) break;
      *piVar18 = *(int *)((ulong)((BStack_1bc.idx_ & 1U) << 4) + 4 +
                         (long)(BStack_1bc.idx_ >> 1) * 0x20 + *(long *)(local_1c8._0_8_ + 0xe0));
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                    *)local_218,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                    *)local_1c8,0);
      auVar27._8_8_ = local_100;
      auVar27._0_8_ = local_1a8;
      lVar13 = x[0xf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      piVar18 = piVar18 + 1;
    }
    local_88 = (double)(long)local_c0[0];
    pdVar2 = (local_250->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    local_1c8._0_8_ = pdVar2[(long)local_88 * 2];
    unique0x10000e80 = (pdVar2 + (long)local_88 * 2)[1];
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    dVar15 = (double)(long)local_c0[1];
    local_218._0_8_ = pdVar2[(long)dVar15 * 2];
    unique0x10000ea0 = (pdVar2 + (long)dVar15 * 2)[1];
    local_208._0_4_ = 0;
    local_208._4_4_ = 0;
    lVar19 = (long)local_c0[2];
    local_188.values_._M_elems[0] = pdVar2[lVar19 * 2];
    local_188.values_._M_elems[1] = (pdVar2 + lVar19 * 2)[1];
    local_178 = 0;
    OpenMesh::VectorT<double,3>::operator-
              (&local_238,(VectorT<double,3> *)local_218,(VectorT<double,_3> *)local_1c8);
    OpenMesh::VectorT<double,3>::operator-
              (&local_128,(VectorT<double,3> *)&local_188,(VectorT<double,_3> *)local_1c8);
    lVar13 = *(long *)((long)x[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data
                             [*(int *)&x[0x1a].
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data] + 0x30);
    uVar17 = *(undefined8 *)(lVar13 + (long)local_88 * 0xc);
    local_148.values_._M_elems[0] = (double)(float)uVar17;
    local_148.values_._M_elems[1] = (double)(float)((ulong)uVar17 >> 0x20);
    local_148.values_._M_elems[2] = (double)*(float *)(lVar13 + 8 + (long)local_88 * 0xc);
    uVar17 = *(undefined8 *)(lVar13 + (long)dVar15 * 0xc);
    local_68 = (double)(float)uVar17;
    dStack_60 = (double)(float)((ulong)uVar17 >> 0x20);
    local_58 = (double)*(float *)(lVar13 + 8 + (long)dVar15 * 0xc);
    uVar17 = *(undefined8 *)(lVar13 + lVar19 * 0xc);
    local_2a8 = (double)*(float *)(lVar13 + 8 + lVar19 * 0xc);
    local_2b8._M_elems[1] = (double)(float)((ulong)uVar17 >> 0x20);
    local_2b8._M_elems[0] = (double)(float)uVar17;
    local_168 = dVar15;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_200,(VectorT<double,3> *)&local_68,&local_148);
    OpenMesh::VectorT<double,3>::operator-(&local_a0,(VectorT<double,3> *)&local_2b8,&local_148);
    local_338.values_._M_elems[0] =
         local_128.values_._M_elems[2] * local_238.values_._M_elems[1] -
         local_238.values_._M_elems[2] * local_128.values_._M_elems[1];
    local_338.values_._M_elems[1] =
         local_128.values_._M_elems[0] * local_238.values_._M_elems[2] -
         local_238.values_._M_elems[0] * local_128.values_._M_elems[2];
    local_338.values_._M_elems[2] =
         local_238.values_._M_elems[0] * local_128.values_._M_elems[1] -
         local_128.values_._M_elems[0] * local_238.values_._M_elems[1];
    local_318 = OpenMesh::VectorT<double,_3>::norm<double>(&local_338);
    local_318 = local_318 * 0.5;
    if ((local_318 == 0.0) && (!NAN(local_318))) goto LAB_0014bd9c;
    local_338.values_._M_elems[0] =
         local_a0.values_._M_elems[2] * local_200._M_elems[1] -
         dStack_1f0 * local_a0.values_._M_elems[1];
    local_338.values_._M_elems[1] =
         local_a0.values_._M_elems[0] * dStack_1f0 -
         local_200._M_elems[0] * local_a0.values_._M_elems[2];
    local_338.values_._M_elems[2] =
         local_200._M_elems[0] * local_a0.values_._M_elems[1] -
         local_a0.values_._M_elems[0] * local_200._M_elems[1];
    local_2c8 = OpenMesh::VectorT<double,_3>::norm<double>(&local_338);
    local_2c8 = local_2c8 * 0.5;
    OpenMesh::VectorT<double,3>::operator-(&local_338,(VectorT<double,3> *)&local_68,&local_148);
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_2b8,&local_148);
    local_268._M_cur =
         (__node_type *)OpenMesh::VectorT<double,3>::operator|(&local_338,(type *)&local_290);
    OpenMesh::VectorT<double,3>::operator-(&local_1e8,(VectorT<double,3> *)&local_68,&local_148);
    OpenMesh::VectorT<double,3>::operator-(&local_d8,(VectorT<double,3> *)&local_2b8,&local_148);
    local_2e8.values_._M_elems[0] =
         local_d8.values_._M_elems[2] * local_1e8.values_._M_elems[1] -
         local_1e8.values_._M_elems[2] * local_d8.values_._M_elems[1];
    local_2e8.values_._M_elems[1] =
         local_d8.values_._M_elems[0] * local_1e8.values_._M_elems[2] -
         local_1e8.values_._M_elems[0] * local_d8.values_._M_elems[2];
    local_2e8.values_._M_elems[2] =
         local_1e8.values_._M_elems[0] * local_d8.values_._M_elems[1] -
         local_d8.values_._M_elems[0] * local_1e8.values_._M_elems[1];
    local_190 = OpenMesh::VectorT<double,_3>::norm<double>(&local_2e8);
    local_190 = (double)local_268._M_cur / local_190;
    OpenMesh::VectorT<double,3>::operator-
              (&local_338,(VectorT<double,3> *)&local_2b8,(VectorT<double,_3> *)&local_68);
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_148,(VectorT<double,_3> *)&local_68);
    local_268._M_cur =
         (__node_type *)OpenMesh::VectorT<double,3>::operator|(&local_338,(type *)&local_290);
    OpenMesh::VectorT<double,3>::operator-
              (&local_1e8,(VectorT<double,3> *)&local_2b8,(VectorT<double,_3> *)&local_68);
    OpenMesh::VectorT<double,3>::operator-
              (&local_d8,(VectorT<double,3> *)&local_148,(VectorT<double,_3> *)&local_68);
    local_2e8.values_._M_elems[0] =
         local_d8.values_._M_elems[2] * local_1e8.values_._M_elems[1] -
         local_1e8.values_._M_elems[2] * local_d8.values_._M_elems[1];
    local_2e8.values_._M_elems[1] =
         local_d8.values_._M_elems[0] * local_1e8.values_._M_elems[2] -
         local_1e8.values_._M_elems[0] * local_d8.values_._M_elems[2];
    local_2e8.values_._M_elems[2] =
         local_1e8.values_._M_elems[0] * local_d8.values_._M_elems[1] -
         local_d8.values_._M_elems[0] * local_1e8.values_._M_elems[1];
    local_198 = OpenMesh::VectorT<double,_3>::norm<double>(&local_2e8);
    local_198 = (double)local_268._M_cur / local_198;
    OpenMesh::VectorT<double,3>::operator-
              (&local_338,(VectorT<double,3> *)&local_68,(VectorT<double,_3> *)&local_2b8);
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_148,(VectorT<double,_3> *)&local_2b8);
    local_268._M_cur =
         (__node_type *)OpenMesh::VectorT<double,3>::operator|(&local_338,(type *)&local_290);
    uStack_260 = extraout_XMM0_Qb;
    OpenMesh::VectorT<double,3>::operator-
              (&local_1e8,(VectorT<double,3> *)&local_68,(VectorT<double,_3> *)&local_2b8);
    OpenMesh::VectorT<double,3>::operator-
              (&local_d8,(VectorT<double,3> *)&local_148,(VectorT<double,_3> *)&local_2b8);
    local_2e8.values_._M_elems[2] =
         local_1e8.values_._M_elems[0] * local_d8.values_._M_elems[1] -
         local_d8.values_._M_elems[0] * local_1e8.values_._M_elems[1];
    local_2e8.values_._M_elems[1] =
         local_d8.values_._M_elems[0] * local_1e8.values_._M_elems[2] -
         local_1e8.values_._M_elems[0] * local_d8.values_._M_elems[2];
    local_2e8.values_._M_elems[0] =
         local_d8.values_._M_elems[2] * local_1e8.values_._M_elems[1] -
         local_1e8.values_._M_elems[2] * local_d8.values_._M_elems[1];
    local_f8 = OpenMesh::VectorT<double,_3>::norm<double>(&local_2e8);
    local_78 = local_2c8 * local_2c8;
    local_1a0 = local_318 * local_318;
    uStack_70 = 0;
    local_e0 = local_78 / local_1a0 + 1.0;
    local_300 = OpenMesh::VectorT<double,_3>::norm<double>(&local_128);
    local_298 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)&local_200);
    local_f0 = OpenMesh::VectorT<double,_3>::norm<double>(&local_238);
    dVar15 = OpenMesh::VectorT<double,_3>::norm<double>(&local_a0);
    local_300 = dVar15 * dVar15 * local_f0 * local_f0 +
                local_298 * local_298 * local_300 * local_300;
    local_298 = OpenMesh::VectorT<double,3>::operator|(&local_128,&local_238);
    dVar15 = OpenMesh::VectorT<double,3>::operator|(&local_a0,(VectorT<double,_3> *)&local_200);
    local_e8 = (local_298 * -2.0 * dVar15 + local_300) / (local_2c8 * 4.0);
    OpenMesh::VectorT<double,3>::operator-
              (&local_338,(VectorT<double,3> *)&local_188,(VectorT<double,_3> *)local_218);
    local_2c8 = local_338.values_._M_elems[1];
    uStack_2c0 = 0;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_188,(VectorT<double,_3> *)local_218);
    local_338.values_._M_elems[0] = -local_2c8;
    local_2f8._M_elems[1] = local_290._M_elems[0];
    local_2f8._M_elems[0] = local_338.values_._M_elems[0];
    local_338.values_._M_elems[1] = local_290._M_elems[0];
    local_338.values_._M_elems[2] = 0.0;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)local_1c8,(VectorT<double,_3> *)local_218);
    dVar15 = OpenMesh::VectorT<double,3>::operator|(&local_338,(VectorT<double,_3> *)&local_290);
    if (dVar15 < 0.0) {
      local_2f8._M_elems =
           (_Type)OpenMesh::VectorT<double,_2>::operator-((VectorT<double,_2> *)&local_2f8);
    }
    uStack_70 = uStack_70 ^ 0x8000000000000000;
    local_78 = -local_78 / (local_318 * local_1a0);
    local_338.values_._M_elems[0] = local_78;
    local_158._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator*
                          ((VectorT<double,2> *)&local_2f8,(double *)&local_338);
    local_268._M_cur = (__node_type *)(local_268._M_cur / local_f8);
    local_2c8 = -(double)local_268._M_cur;
    uStack_2c0 = uStack_260 ^ 0x8000000000000000;
    local_240 = local_2c8;
    OpenMesh::VectorT<double,3>::operator*(&local_2e8,(VectorT<double,3> *)local_218,&local_240);
    OpenMesh::VectorT<double,3>::operator*(&local_1e8,(VectorT<double,3> *)&local_188,&local_198);
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_2e8,(VectorT<double,_3> *)&local_1e8);
    local_248 = local_198 + (double)local_268._M_cur;
    OpenMesh::VectorT<double,3>::operator*(&local_d8,(VectorT<double,3> *)local_1c8,&local_248);
    OpenMesh::VectorT<double,3>::operator+(&local_338,(VectorT<double,3> *)&local_290,&local_d8);
    local_290._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_158,&local_e8);
    local_1e8.values_._M_elems[0] = local_338.values_._M_elems[0];
    local_1e8.values_._M_elems[1] = local_338.values_._M_elems[1];
    local_2e8.values_._M_elems._0_16_ =
         OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_1e8,&local_e0);
    tVar31 = OpenMesh::VectorT<double,2>::operator+
                       ((VectorT<double,2> *)&local_290,(VectorT<double,_2> *)&local_2e8);
    dVar15 = (double)(local_278 + (long)local_88 * 2)[1];
    local_278[(long)local_88 * 2] =
         tVar31.values_._M_elems[0] + (double)local_278[(long)local_88 * 2];
    (local_278 + (long)local_88 * 2)[1] = tVar31.values_._M_elems[1] + dVar15;
    OpenMesh::VectorT<double,3>::operator-
              (&local_338,(VectorT<double,3> *)local_1c8,(VectorT<double,_3> *)&local_188);
    local_88 = local_338.values_._M_elems[1];
    uStack_80 = 0;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)local_1c8,(VectorT<double,_3> *)&local_188);
    local_338.values_._M_elems[0] = -local_88;
    local_2f8._M_elems[1] = local_290._M_elems[0];
    local_2f8._M_elems[0] = local_338.values_._M_elems[0];
    local_338.values_._M_elems[1] = local_290._M_elems[0];
    local_338.values_._M_elems[2] = 0.0;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)local_218,(VectorT<double,_3> *)local_1c8);
    dVar15 = OpenMesh::VectorT<double,3>::operator|(&local_338,(type *)&local_290);
    if (dVar15 < 0.0) {
      local_2f8._M_elems =
           (_Type)OpenMesh::VectorT<double,_2>::operator-((VectorT<double,_2> *)&local_2f8);
    }
    local_338.values_._M_elems[0] = local_78;
    local_158._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator*
                          ((VectorT<double,2> *)&local_2f8,(double *)&local_338);
    local_240 = local_2c8;
    OpenMesh::VectorT<double,3>::operator*(&local_2e8,(VectorT<double,3> *)local_1c8,&local_240);
    OpenMesh::VectorT<double,3>::operator*(&local_1e8,(VectorT<double,3> *)&local_188,&local_190);
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_2e8,(VectorT<double,_3> *)&local_1e8);
    local_248 = (double)local_268._M_cur + local_190;
    OpenMesh::VectorT<double,3>::operator*(&local_d8,(VectorT<double,3> *)local_218,&local_248);
    OpenMesh::VectorT<double,3>::operator+(&local_338,(VectorT<double,3> *)&local_290,&local_d8);
    local_290._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_158,&local_e8);
    local_1e8.values_._M_elems[0] = local_338.values_._M_elems[0];
    local_1e8.values_._M_elems[1] = local_338.values_._M_elems[1];
    local_2e8.values_._M_elems._0_16_ =
         OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_1e8,&local_e0);
    tVar31 = OpenMesh::VectorT<double,2>::operator+
                       ((VectorT<double,2> *)&local_290,(VectorT<double,_2> *)&local_2e8);
    dVar15 = (double)(local_278 + (long)local_168 * 2)[1];
    local_278[(long)local_168 * 2] =
         tVar31.values_._M_elems[0] + (double)local_278[(long)local_168 * 2];
    (local_278 + (long)local_168 * 2)[1] = tVar31.values_._M_elems[1] + dVar15;
    OpenMesh::VectorT<double,3>::operator-
              (&local_338,(VectorT<double,3> *)local_218,(VectorT<double,_3> *)local_1c8);
    local_268._M_cur = (__node_type *)local_338.values_._M_elems[1];
    uStack_260 = 0;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)local_218,(VectorT<double,_3> *)local_1c8);
    local_338.values_._M_elems[0] = -(double)local_268._M_cur;
    local_2f8._M_elems[1] = local_290._M_elems[0];
    local_2f8._M_elems[0] = local_338.values_._M_elems[0];
    local_338.values_._M_elems[1] = local_290._M_elems[0];
    local_338.values_._M_elems[2] = 0.0;
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_188,(VectorT<double,_3> *)local_1c8);
    dVar15 = OpenMesh::VectorT<double,3>::operator|(&local_338,(type *)&local_290);
    if (dVar15 < 0.0) {
      local_2f8._M_elems =
           (_Type)OpenMesh::VectorT<double,_2>::operator-((VectorT<double,_2> *)&local_2f8);
    }
    local_338.values_._M_elems[0] = local_78;
    local_158._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator*
                          ((VectorT<double,2> *)&local_2f8,(double *)&local_338);
    local_240 = -local_190;
    OpenMesh::VectorT<double,3>::operator*(&local_2e8,(VectorT<double,3> *)local_218,&local_240);
    OpenMesh::VectorT<double,3>::operator*(&local_1e8,(VectorT<double,3> *)local_1c8,&local_198);
    OpenMesh::VectorT<double,3>::operator-
              ((type *)&local_290,(VectorT<double,3> *)&local_2e8,(VectorT<double,_3> *)&local_1e8);
    local_248 = local_190 + local_198;
    OpenMesh::VectorT<double,3>::operator*(&local_d8,(VectorT<double,3> *)&local_188,&local_248);
    OpenMesh::VectorT<double,3>::operator+(&local_338,(VectorT<double,3> *)&local_290,&local_d8);
    local_290._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_158,&local_e8);
    local_1e8.values_._M_elems[0] = local_338.values_._M_elems[0];
    local_1e8.values_._M_elems[1] = local_338.values_._M_elems[1];
    local_2e8.values_._M_elems._0_16_ =
         OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_1e8,&local_e0);
    tVar31 = OpenMesh::VectorT<double,2>::operator+
                       ((VectorT<double,2> *)&local_290,(VectorT<double,_2> *)&local_2e8);
    auVar27 = *(undefined1 (*) [16])(local_278 + lVar19 * 2);
    local_278[lVar19 * 2] = tVar31.values_._M_elems[0] + auVar27._0_8_;
    (local_278 + lVar19 * 2)[1] = tVar31.values_._M_elems[1] + auVar27._8_8_;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_50);
    auVar27._8_8_ = local_100;
    auVar27._0_8_ = local_1a8;
  }
  local_100 = uVar17;
  _local_1c8 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)x);
  auVar28 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)x);
  uVar17 = auVar28._8_8_;
  params = local_250;
  while( true ) {
    puVar12 = auVar28._8_8_;
    pPVar21 = auVar28._0_8_;
    lVar13 = (long)stack0xfffffffffffffe40;
    if (local_1c8._8_4_ == (int)uVar17 && (mesh_ptr)local_1c8._0_8_ == pPVar21) break;
    local_2e8.values_._M_elems[0]._0_4_ = local_1c8._8_4_;
    bVar7 = OpenMesh::PolyConnectivity::is_boundary
                      ((PolyConnectivity *)x,(EdgeHandle)local_1c8._8_4_);
    cVar32._M_elems[1] = local_f8;
    cVar32._M_elems[0] = local_f0;
    if (bVar7) {
      pdVar2 = x[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar13 = ((lVar13 << 0x21) >> 0x21) * 0x20;
      dVar11 = (double)(long)*(int *)((long)pdVar2 + lVar13 + 4);
      dVar20 = (double)(long)*(int *)((long)pdVar2 + lVar13 + 0x14);
      pdVar3 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar2 = pdVar3 + (long)dVar11 * 2;
      local_218._0_8_ = *pdVar2;
      unique0x10000f40 = pdVar2[1];
      pdVar3 = pdVar3 + (long)dVar20 * 2;
      local_188.values_._M_elems[0] = *pdVar3;
      local_188.values_._M_elems[1] = pdVar3[1];
      local_40 = uVar17;
      local_38 = pPVar21;
      cVar32._M_elems =
           (_Type)OpenMesh::VectorT<double,2>::operator-
                            ((VectorT<double,2> *)&local_188,(VectorT<double,_2> *)local_218);
      local_1a8 = (double)((long)dVar11 * 2);
      local_1a0 = (double)((long)dVar20 * 2);
      pdVar2 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      dVar15 = pdVar2[(long)dVar20 * 2];
      dVar24 = pdVar2[(long)dVar11 * 2];
      dVar26 = dVar15;
      if (dVar24 <= dVar15) {
        dVar26 = dVar24;
      }
      local_a8 = (int)(dVar26 / local_258 + -1.0);
      if (dVar15 <= dVar24) {
        dVar15 = dVar24;
      }
      iVar14 = (int)(dVar15 / local_258 + 1.0);
      dVar15 = pdVar2[(int)(SUB84(local_1a0,0) | 1)];
      dVar24 = pdVar2[(int)(SUB84(local_1a8,0) | 1)];
      dVar26 = dVar15;
      if (dVar24 <= dVar15) {
        dVar26 = dVar24;
      }
      iVar8 = (int)(dVar26 / local_258 + -1.0);
      if (dVar15 <= dVar24) {
        dVar15 = dVar24;
      }
      local_a4 = (int)(dVar15 / local_258 + 1.0);
      local_298 = SQRT(cVar32._M_elems[1] * cVar32._M_elems[1] +
                       cVar32._M_elems[0] * cVar32._M_elems[0]);
      local_b0 = iVar8;
      local_ac = iVar14;
      local_88 = dVar20;
      local_78 = dVar11;
      for (; uVar17 = local_40, pPVar21 = local_38, iVar10 = iVar8, local_a8 <= iVar14;
          local_a8 = local_a8 + 1) {
        while( true ) {
          local_f8 = cVar32._M_elems[1];
          local_f0 = cVar32._M_elems[0];
          if (local_a4 < iVar10) break;
          local_100 = CONCAT44(local_100._4_4_,iVar10);
          local_238.values_._M_elems[0] = (double)CONCAT44(iVar10,local_a8);
          pVar29 = std::
                   _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   ::equal_range(&neighbors._M_h,(key_type *)&local_238);
          while( true ) {
            local_268._M_cur =
                 (__node_type *)
                 pVar29.second.
                 super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>.
                 _M_cur;
            _Var16 = pVar29.first.
                     super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                     ._M_cur;
            cVar32._M_elems[1] = local_f8;
            cVar32._M_elems[0] = local_f0;
            if (_Var16.
                super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>.
                _M_cur == (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                           )local_268._M_cur) break;
            iVar14 = *(int *)((long)_Var16.
                                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                    ._M_cur + 0x10);
            if ((iVar14 != local_78._0_4_) && (iVar14 != local_88._0_4_)) {
              pdVar2 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + (long)iVar14 * 2;
              local_238.values_._M_elems[0] = *pdVar2;
              local_238.values_._M_elems[1] = pdVar2[1];
              tVar31 = OpenMesh::VectorT<double,2>::operator-
                                 ((VectorT<double,2> *)&local_238,(VectorT<double,_2> *)local_218);
              local_2c8 = tVar31.values_._M_elems[1];
              local_318 = tVar31.values_._M_elems[0];
              local_128.values_._M_elems[0] =
                   (double)CONCAT44(local_128.values_._M_elems[0]._4_4_,
                                    *(undefined4 *)
                                     ((long)_Var16.
                                            super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                            ._M_cur + 0x10));
              dVar15 = getDistance((Mesh *)x,params,(EdgeHandle *)&local_2e8,
                                   (VertexHandle *)&local_128);
              if ((dVar15 == 0.0) && (!NAN(dVar15))) goto LAB_0014bd9c;
              dVar15 = local_258 / dVar15 + -1.0;
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (((dVar15 != 0.0) || (NAN(dVar15))) &&
                 (*(int *)((long)_Var16.
                                 super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                 ._M_cur + 0x10) != -1)) {
                uStack_160 = 0;
                lVar13 = (long)*(int *)((long)_Var16.
                                              super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                              ._M_cur + 0x10);
                pdVar2 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar13 * 2;
                local_128.values_._M_elems[0] = *pdVar2;
                local_128.values_._M_elems[1] = pdVar2[1];
                local_148.values_._M_elems[0] = (double)local_218._0_8_;
                local_148.values_._M_elems[1] = stack0xfffffffffffffdf0;
                local_68 = local_188.values_._M_elems[0];
                dStack_60 = local_188.values_._M_elems[1];
                local_168 = dVar15;
                tVar31 = OpenMesh::VectorT<double,2>::operator-
                                   ((VectorT<double,2> *)&local_128,(VectorT<double,_2> *)&local_148
                                   );
                local_300 = tVar31.values_._M_elems[0];
                tVar33 = OpenMesh::VectorT<double,2>::operator-
                                   ((VectorT<double,2> *)&local_128,(VectorT<double,_2> *)&local_148
                                   );
                dVar15 = (local_2c8 * local_f8 + local_318 * local_f0) / local_298;
                dVar15 = (tVar31.values_._M_elems[1] * tVar33.values_._M_elems[1] +
                         local_300 * tVar33.values_._M_elems[0]) - dVar15 * dVar15;
                if (dVar15 < 0.0) {
                  local_2c8 = sqrt(dVar15);
                  uStack_2c0 = extraout_XMM0_Qb_00;
                }
                else {
                  local_2c8 = SQRT(dVar15);
                  uStack_2c0 = 0;
                }
                tVar31 = OpenMesh::VectorT<double,2>::operator-
                                   ((VectorT<double,2> *)&local_238,&local_188);
                local_318 = tVar31.values_._M_elems[0];
                tVar33 = OpenMesh::VectorT<double,2>::operator-
                                   ((VectorT<double,2> *)local_218,&local_188);
                if (0.0 <= tVar31.values_._M_elems[1] * tVar33.values_._M_elems[1] +
                           local_318 * tVar33.values_._M_elems[0]) {
                  tVar31 = OpenMesh::VectorT<double,2>::operator-
                                     ((VectorT<double,2> *)&local_238,
                                      (VectorT<double,_2> *)local_218);
                  local_318 = tVar31.values_._M_elems[0];
                  tVar33 = OpenMesh::VectorT<double,2>::operator-
                                     ((VectorT<double,2> *)&local_188,
                                      (VectorT<double,_2> *)local_218);
                  if (0.0 <= tVar31.values_._M_elems[1] * tVar33.values_._M_elems[1] +
                             local_318 * tVar33.values_._M_elems[0]) {
                    tVar31 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_128,
                                        (VectorT<double,_2> *)&local_148);
                    local_318 = tVar31.values_._M_elems[1];
                    tVar33 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_68,
                                        (VectorT<double,_2> *)&local_148);
                    local_290._M_elems[0] =
                         (local_318 * tVar33.values_._M_elems[1] +
                         tVar31.values_._M_elems[0] * tVar33.values_._M_elems[0]) / local_298;
                    local_200._M_elems =
                         (_Type)OpenMesh::VectorT<double,2>::operator-
                                          ((VectorT<double,2> *)&local_128,
                                           (VectorT<double,_2> *)&local_148);
                    local_338.values_._M_elems._0_16_ =
                         OpenMesh::VectorT<double,2>::operator-
                                   ((VectorT<double,2> *)&local_68,(VectorT<double,_2> *)&local_148)
                    ;
                    this = (VectorT<double,2> *)
                           OpenMesh::VectorT<double,_2>::normalize<double>
                                     ((VectorT<double,_2> *)&local_338);
                    local_a0.values_._M_elems._0_16_ =
                         OpenMesh::VectorT<double,2>::operator*(this,(double *)&local_290);
                    local_2b8._M_elems =
                         (_Type)OpenMesh::VectorT<double,2>::operator-
                                          ((VectorT<double,2> *)&local_200,
                                           (VectorT<double,_2> *)&local_a0);
                    pVVar9 = OpenMesh::VectorT<double,_2>::normalize<double>
                                       ((VectorT<double,_2> *)&local_2b8);
                    local_2b8._M_elems = *&(pVVar9->values_)._M_elems;
                    local_168 = local_168 * -2.0 * local_258;
                    local_318 = local_290._M_elems[0] * local_168;
                    tVar31 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_68,
                                        (VectorT<double,_2> *)&local_148);
                    local_300 = tVar31.values_._M_elems[0];
                    tVar33 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_68,
                                        (VectorT<double,_2> *)&local_148);
                    local_a0.values_._M_elems[0] =
                         local_318 /
                         (tVar31.values_._M_elems[1] * tVar33.values_._M_elems[1] +
                         local_300 * tVar33.values_._M_elems[0]);
                    local_200._M_elems =
                         (_Type)OpenMesh::VectorT<double,2>::operator*
                                          ((VectorT<double,2> *)&local_2b8,(double *)&local_a0);
                    local_2c8 = local_2c8 * local_2c8;
                    local_338.values_._M_elems[0] = local_2c8;
                    tVar31 = OpenMesh::VectorT<double,2>::operator/
                                       ((VectorT<double,2> *)&local_200,(double *)&local_338);
                    dVar15 = (double)(local_278 + (long)local_1a0)[1];
                    local_278[(long)local_1a0] =
                         tVar31.values_._M_elems[0] + (double)local_278[(long)local_1a0];
                    (local_278 + (long)local_1a0)[1] = tVar31.values_._M_elems[1] + dVar15;
                    tVar31 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_128,
                                        (VectorT<double,_2> *)&local_68);
                    local_318 = tVar31.values_._M_elems[1];
                    tVar33 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_148,
                                        (VectorT<double,_2> *)&local_68);
                    local_318 = (local_318 * tVar33.values_._M_elems[1] +
                                tVar31.values_._M_elems[0] * tVar33.values_._M_elems[0]) / local_298
                    ;
                    local_290._M_elems[0] = local_318;
                    tVar31 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_68,
                                        (VectorT<double,_2> *)&local_148);
                    local_300 = tVar31.values_._M_elems[0];
                    tVar33 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,2> *)&local_68,
                                        (VectorT<double,_2> *)&local_148);
                    local_a0.values_._M_elems[0] =
                         (local_318 * local_168) /
                         (tVar31.values_._M_elems[1] * tVar33.values_._M_elems[1] +
                         local_300 * tVar33.values_._M_elems[0]);
                    local_200._M_elems =
                         (_Type)OpenMesh::VectorT<double,2>::operator*
                                          ((VectorT<double,2> *)&local_2b8,(double *)&local_a0);
                    local_338.values_._M_elems[0] = local_2c8;
                    tVar31 = OpenMesh::VectorT<double,2>::operator/
                                       ((VectorT<double,2> *)&local_200,(double *)&local_338);
                    dVar15 = (double)(local_278 + (long)local_1a8)[1];
                    local_278[(long)local_1a8] =
                         tVar31.values_._M_elems[0] + (double)local_278[(long)local_1a8];
                    (local_278 + (long)local_1a8)[1] = tVar31.values_._M_elems[1] + dVar15;
                    local_a0.values_._M_elems[0] = local_168;
                    local_200._M_elems =
                         (_Type)OpenMesh::VectorT<double,2>::operator*
                                          ((VectorT<double,2> *)&local_2b8,(double *)&local_a0);
                    local_338.values_._M_elems[0] = local_2c8;
                    tVar31 = OpenMesh::VectorT<double,2>::operator/
                                       ((VectorT<double,2> *)&local_200,(double *)&local_338);
                    auVar27 = *(undefined1 (*) [16])(local_278 + lVar13 * 2);
                    local_278[lVar13 * 2] = tVar31.values_._M_elems[0] + auVar27._0_8_;
                    (local_278 + lVar13 * 2)[1] = tVar31.values_._M_elems[1] + auVar27._8_8_;
                    params = local_250;
                    goto LAB_0014bd3f;
                  }
                  local_2b8._M_elems =
                       (_Type)OpenMesh::VectorT<double,2>::operator-
                                        ((VectorT<double,2> *)&local_238,
                                         (VectorT<double,_2> *)local_218);
                  pVVar9 = OpenMesh::VectorT<double,_2>::normalize<double>
                                     ((VectorT<double,_2> *)&local_2b8);
                  local_318 = (pVVar9->values_)._M_elems[0];
                  dStack_310 = (pVVar9->values_)._M_elems[1];
                  local_2b8._M_elems =
                       (_Type)OpenMesh::VectorT<double,2>::operator-
                                        ((VectorT<double,2> *)&local_238,
                                         (VectorT<double,_2> *)local_218);
                  pVVar9 = OpenMesh::VectorT<double,_2>::normalize<double>
                                     ((VectorT<double,_2> *)&local_2b8);
                  vVar34 = OpenMesh::VectorT<double,_2>::operator-(pVVar9);
                  dVar24 = local_168 * -2.0 * local_258;
                  dVar26 = local_2c8 * local_2c8;
                  auVar23._0_8_ = vVar34.values_._M_elems[0] * dVar24;
                  auVar23._8_8_ = vVar34.values_._M_elems[1] * dVar24;
                  auVar6._8_8_ = dVar26;
                  auVar6._0_8_ = dVar26;
                  auVar27 = divpd(auVar23,auVar6);
                  dVar15 = local_1a8;
                }
                else {
                  local_2b8._M_elems =
                       (_Type)OpenMesh::VectorT<double,2>::operator-
                                        ((VectorT<double,2> *)&local_238,&local_188);
                  pVVar9 = OpenMesh::VectorT<double,_2>::normalize<double>
                                     ((VectorT<double,_2> *)&local_2b8);
                  local_318 = (pVVar9->values_)._M_elems[0];
                  dStack_310 = (pVVar9->values_)._M_elems[1];
                  local_2b8._M_elems =
                       (_Type)OpenMesh::VectorT<double,2>::operator-
                                        ((VectorT<double,2> *)&local_238,&local_188);
                  pVVar9 = OpenMesh::VectorT<double,_2>::normalize<double>
                                     ((VectorT<double,_2> *)&local_2b8);
                  vVar34 = OpenMesh::VectorT<double,_2>::operator-(pVVar9);
                  dVar24 = local_168 * -2.0 * local_258;
                  dVar26 = local_2c8 * local_2c8;
                  auVar22._0_8_ = vVar34.values_._M_elems[0] * dVar24;
                  auVar22._8_8_ = vVar34.values_._M_elems[1] * dVar24;
                  auVar4._8_8_ = dVar26;
                  auVar4._0_8_ = dVar26;
                  auVar27 = divpd(auVar22,auVar4);
                  dVar15 = local_1a0;
                }
                dVar11 = (double)(local_278 + (long)dVar15)[1];
                local_278[(long)dVar15] = (double)local_278[(long)dVar15] + auVar27._0_8_;
                (local_278 + (long)dVar15)[1] = dVar11 + auVar27._8_8_;
                auVar25._0_8_ = dVar24 * local_318;
                auVar25._8_8_ = dVar24 * dStack_310;
                auVar5._8_8_ = dVar26;
                auVar5._0_8_ = dVar26;
                auVar27 = divpd(auVar25,auVar5);
                dVar15 = (double)(local_278 + lVar13 * 2)[1];
                local_278[lVar13 * 2] = (double)local_278[lVar13 * 2] + auVar27._0_8_;
                (local_278 + lVar13 * 2)[1] = dVar15 + auVar27._8_8_;
                params = local_250;
              }
            }
LAB_0014bd3f:
            pVar29.second.
            super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>._M_cur
                 = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>)
                   (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>)
                   local_268._M_cur;
            pVar29.first.
            super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>._M_cur
                 = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>)
                   (__node_type *)
                   *(_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> *)
                    _Var16.
                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                    ._M_cur;
          }
          iVar10 = (int)local_100 + 1;
          iVar14 = local_ac;
          iVar8 = local_b0;
        }
      }
    }
    local_f8 = cVar32._M_elems[1];
    local_f0 = cVar32._M_elems[0];
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)local_1c8);
    auVar28._8_8_ = extraout_RDX;
    auVar28._0_8_ = pPVar21;
  }
  *(undefined8 **)
   &(local_108->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity = local_278;
LAB_0014bdbc:
  *(undefined8 *)
   &(local_108->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity.field_0x8 = local_270;
  tVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)puVar12;
  tVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_108;
  return (type)tVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
LAB_0014bd9c:
  *local_278 = 0x7ff0000000000000;
  *(undefined8 **)
   &(local_108->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity = local_278;
  puVar12 = local_278;
  goto LAB_0014bdbc;
}

Assistant:

auto calcGrad(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    // update the hashmap for computing the energy and gradient
    initHashMap(mesh, x, epsilon);
    // the energy term
    Eigen::VectorXd gradx(x.size());
    gradx.setZero();
    // the gradient for distortion term
    for (auto f: mesh.all_faces()) {
        Mesh::VertexHandle vs[3];
        int i = 0;
        for (auto itr = mesh.cfv_ccwbegin(f); itr != mesh.cfv_ccwend(f); itr++)
            vs[i++] = *itr;
        OpenMesh::Vec3d u0(x[2 * vs[0].idx()], x[2 * vs[0].idx() + 1], 0.0);
        OpenMesh::Vec3d u1(x[2 * vs[1].idx()], x[2 * vs[1].idx() + 1], 0.0);
        OpenMesh::Vec3d u2(x[2 * vs[2].idx()], x[2 * vs[2].idx() + 1], 0.0);
        OpenMesh::Vec3d ue1 = u1 - u0;
        OpenMesh::Vec3d ue2 = u2 - u0;

        OpenMesh::Vec3d p0(mesh.point(vs[0])[0], mesh.point(vs[0])[1], mesh.point(vs[0])[2]);
        OpenMesh::Vec3d p1(mesh.point(vs[1])[0], mesh.point(vs[1])[1], mesh.point(vs[1])[2]);
        OpenMesh::Vec3d p2(mesh.point(vs[2])[0], mesh.point(vs[2])[1], mesh.point(vs[2])[2]);
        OpenMesh::Vec3d pe1 = p1 - p0;
        OpenMesh::Vec3d pe2 = p2 - p0;

        // calculate the area of corresponding triangle
        double su = 0.5 * OpenMesh::cross(ue1, ue2).norm();
        if (su == 0.0) {
            gradx[0] = std::numeric_limits<double>::infinity();
            return std::move(gradx);
        }
        double sp = 0.5 * OpenMesh::cross(pe1, pe2).norm();

        double cot0 = OpenMesh::dot(p1 - p0, p2 - p0) / OpenMesh::cross(p1 - p0, p2 - p0).norm();
        double cot1 = OpenMesh::dot(p2 - p1, p0 - p1) / OpenMesh::cross(p2 - p1, p0 - p1).norm();
        double cot2 = OpenMesh::dot(p1 - p2, p0 - p2) / OpenMesh::cross(p1 - p2, p0 - p2).norm();
        
        double term1 = (1 + (sp * sp) / (su * su));
        double term2 = (sq(ue2.norm()) * sq(pe1.norm()) + sq(ue1.norm()) * sq(pe2.norm()) - 2.0f * dot(ue2, ue1) * dot(pe2, pe1)) / (4.0f * sp);

        {
            // dE / du0
            OpenMesh::Vec2d height(-(u2 - u1)[1], (u2 - u1)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u0 - u1) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du0 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du0 = -cot2 * u1 - cot1 * u2 + (cot1 + cot2) * u0;
            OpenMesh::Vec2d dE_du0 = dterm1_du0 * term2 + OpenMesh::Vec2d(dterm2_du0[0], dterm2_du0[1]) * term1; 
            gradx[vs[0].idx() * 2] += dE_du0[0];
            gradx[vs[0].idx() * 2 + 1] += dE_du0[1];
        }

        {
            // dE / du1
            OpenMesh::Vec2d height(-(u0 - u2)[1], (u0 - u2)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u1 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du1 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du1 = -cot2 * u0 - cot0 * u2 + (cot0 + cot2) * u1;
            OpenMesh::Vec2d dE_du1 = dterm1_du1 * term2 + OpenMesh::Vec2d(dterm2_du1[0], dterm2_du1[1]) * term1; 
            gradx[vs[1].idx() * 2] += dE_du1[0];
            gradx[vs[1].idx() * 2 + 1] += dE_du1[1];
        }

        {
            // dE / du2
            OpenMesh::Vec2d height(-(u1 - u0)[1], (u1 - u0)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u2 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du2 = -(sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du2 = -cot0 * u1 - cot1 * u0 + (cot0 + cot1) * u2;
            OpenMesh::Vec2d dE_du2 = dterm1_du2 * term2 + OpenMesh::Vec2d(dterm2_du2[0], dterm2_du2[1]) * term1; 
            gradx[vs[2].idx() * 2] += dE_du2[0];
            gradx[vs[2].idx() * 2 + 1] += dE_du2[1];
        }
    }

    int cnt = 0;
    // the singularity term
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            double seng = 0.0;
            int ui_idx = -1;

            int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            OpenMesh::Vec2d pst(x[2 * st], x[2 * st + 1]);
            OpenMesh::Vec2d pend(x[2 * end], x[2 * end + 1]);
            OpenMesh::Vec2d edge = pend - pst;

            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            OpenMesh::Vec2d point(x[itr->second * 2], x[itr->second * 2 + 1]);
                            double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));

                            if (dis == 0.0) {
                                gradx[0] = std::numeric_limits<double>::infinity();
                                return std::move(gradx);
                            }
                            seng = std::max(0.0, epsilon / dis - 1.0);
                            // calculate the gradient
                            ui_idx = itr->second;
                            if (ui_idx != -1 && seng != 0.0) {
                                OpenMesh::Vec2d grad_maxui;
                                OpenMesh::Vec2d grad_maxu1;
                                OpenMesh::Vec2d grad_maxu2;
                                OpenMesh::Vec2d ui(x[ui_idx * 2], x[ui_idx * 2 + 1]);
                                auto u1 = pst;
                                auto u2 = pend;
                                double dis = sqrt(OpenMesh::dot(ui - u1, ui - u1) - projected * projected);
                                
                                if (OpenMesh::dot(point - pend, pst - pend) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pend).normalize();
                                    OpenMesh::Vec2d dir_u2 = -(point - pend).normalize();
                                    
                                    // dE / du2
                                    gradx[end * 2] += -2.0 * seng * epsilon * dir_u2[0] / (dis * dis);
                                    gradx[end * 2 + 1] +=  -2.0 * seng * epsilon * dir_u2[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);
                                }
                                else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pst).normalize();
                                    OpenMesh::Vec2d dir_u1 = -(point - pst).normalize();

                                    // dE / du1
                                    gradx[st * 2] += -2.0 * seng * epsilon * dir_u1[0] / (dis * dis);
                                    gradx[st * 2 + 1] +=  -2.0 * seng * epsilon * dir_u1[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);

                                }
                                else {
                                    double projected = OpenMesh::dot(ui - u1, u2 - u1) / edge.norm();
                                    // the unit vector othorgonal to the edge
                                    auto normal = ui - u1 - (u2 - u1).normalize() * projected;
                                    normal = normal.normalize();
                                    // dE / du2 u2 is the end point of this edge
                                    grad_maxu2 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[end * 2] += grad_maxu2[0];
                                    gradx[end * 2 + 1] += grad_maxu2[1];
                                    // dE / du1 u1 is the start point of this edge
                                    projected = OpenMesh::dot(ui - u2, u1 - u2) / edge.norm();
                                    grad_maxu1 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[st * 2] += grad_maxu1[0];
                                    gradx[st * 2 + 1] += grad_maxu1[1];
                                    // dE / dui ui is the point with maximal distance
                                    grad_maxui = -2 * seng * epsilon * normal / (dis * dis);
                                    gradx[ui_idx * 2] += grad_maxui[0];
                                    gradx[ui_idx * 2 + 1] += grad_maxui[1];
                                }
                            }
                        }
                }
        }
    return std::move(gradx);
}